

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie_swap.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_2dedeb::getVersion(void *data,int32_t length,UBool anyEndianOk)

{
  int iVar1;
  uint32_t signature;
  UBool anyEndianOk_local;
  int32_t length_local;
  void *data_local;
  
  if (((length < 0x10) || (data == (void *)0x0)) || (((ulong)data & 3) != 0)) {
    data_local._4_4_ = 0;
  }
  else {
    iVar1 = *data;
    if (iVar1 == 0x54726933) {
      data_local._4_4_ = 3;
    }
    else if ((anyEndianOk == '\0') || (iVar1 != 0x33697254)) {
      if (iVar1 == 0x54726932) {
        data_local._4_4_ = 2;
      }
      else if ((anyEndianOk == '\0') || (iVar1 != 0x32697254)) {
        if (iVar1 == 0x54726965) {
          data_local._4_4_ = 1;
        }
        else if ((anyEndianOk == '\0') || (iVar1 != 0x65697254)) {
          data_local._4_4_ = 0;
        }
        else {
          data_local._4_4_ = 1;
        }
      }
      else {
        data_local._4_4_ = 2;
      }
    }
    else {
      data_local._4_4_ = 3;
    }
  }
  return data_local._4_4_;
}

Assistant:

int32_t
getVersion(const void *data, int32_t length, UBool anyEndianOk) {
    uint32_t signature;
    if(length<16 || data==nullptr || (U_POINTER_MASK_LSB(data, 3)!=0)) {
        return 0;
    }
    signature=*(const uint32_t *)data;
    if(signature==UCPTRIE_SIG) {
        return 3;
    }
    if(anyEndianOk && signature==UCPTRIE_OE_SIG) {
        return 3;
    }
    if(signature==UTRIE2_SIG) {
        return 2;
    }
    if(anyEndianOk && signature==UTRIE2_OE_SIG) {
        return 2;
    }
    if(signature==UTRIE_SIG) {
        return 1;
    }
    if(anyEndianOk && signature==UTRIE_OE_SIG) {
        return 1;
    }
    return 0;
}